

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

void GetNodeTransform(aiMatrix4x4 *matrix,Node *node)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  if ((node->matrix).isPresent == true) {
    matrix->a1 = (node->matrix).value[0];
    matrix->b1 = (node->matrix).value[1];
    matrix->c1 = (node->matrix).value[2];
    matrix->d1 = (node->matrix).value[3];
    matrix->a2 = (node->matrix).value[4];
    matrix->b2 = (node->matrix).value[5];
    matrix->c2 = (node->matrix).value[6];
    matrix->d2 = (node->matrix).value[7];
    matrix->a3 = (node->matrix).value[8];
    matrix->b3 = (node->matrix).value[9];
    matrix->c3 = (node->matrix).value[10];
    matrix->d3 = (node->matrix).value[0xb];
    matrix->a4 = (node->matrix).value[0xc];
    matrix->b4 = (node->matrix).value[0xd];
    matrix->c4 = (node->matrix).value[0xe];
    matrix->d4 = (node->matrix).value[0xf];
    return;
  }
  if ((node->translation).isPresent == true) {
    fVar1 = (node->translation).value[0];
    fVar10 = (node->translation).value[1];
    fVar20 = (node->translation).value[2];
    fVar17 = matrix->a1;
    fVar2 = matrix->a2;
    fVar3 = matrix->a3;
    fVar4 = matrix->b1;
    fVar9 = matrix->b2;
    fVar16 = matrix->b3;
    fVar23 = matrix->c1;
    fVar24 = matrix->c2;
    fVar5 = matrix->c3;
    fVar8 = matrix->d1;
    fVar18 = matrix->d2;
    fVar11 = matrix->d3;
    fVar7 = matrix->a4 * 0.0;
    matrix->a1 = fVar7 + fVar3 * 0.0 + fVar17 + fVar2 * 0.0;
    matrix->a2 = fVar7 + fVar3 * 0.0 + fVar17 * 0.0 + fVar2;
    matrix->a3 = fVar17 * 0.0 + fVar2 * 0.0 + fVar3 + fVar7;
    matrix->a4 = fVar20 * fVar3 + fVar2 * fVar10 + fVar1 * fVar17 + matrix->a4;
    fVar17 = matrix->b4 * 0.0;
    matrix->b1 = fVar17 + fVar16 * 0.0 + fVar4 + fVar9 * 0.0;
    matrix->b2 = fVar17 + fVar16 * 0.0 + fVar4 * 0.0 + fVar9;
    matrix->b3 = fVar4 * 0.0 + fVar9 * 0.0 + fVar16 + fVar17;
    matrix->b4 = fVar20 * fVar16 + fVar9 * fVar10 + fVar1 * fVar4 + matrix->b4;
    fVar17 = matrix->c4 * 0.0;
    matrix->c1 = fVar17 + fVar5 * 0.0 + fVar23 + fVar24 * 0.0;
    matrix->c2 = fVar17 + fVar5 * 0.0 + fVar23 * 0.0 + fVar24;
    matrix->c3 = fVar23 * 0.0 + fVar24 * 0.0 + fVar5 + fVar17;
    matrix->c4 = fVar20 * fVar5 + fVar24 * fVar10 + fVar1 * fVar23 + matrix->c4;
    fVar17 = matrix->d4 * 0.0;
    matrix->d1 = fVar17 + fVar11 * 0.0 + fVar8 + fVar18 * 0.0;
    matrix->d2 = fVar17 + fVar11 * 0.0 + fVar8 * 0.0 + fVar18;
    matrix->d3 = fVar8 * 0.0 + fVar18 * 0.0 + fVar11 + fVar17;
    matrix->d4 = fVar20 * fVar11 + fVar10 * fVar18 + fVar1 * fVar8 + matrix->d4;
  }
  if ((node->rotation).isPresent == true) {
    fVar1 = matrix->a1;
    fVar10 = matrix->a2;
    fVar20 = matrix->a3;
    fVar17 = matrix->b1;
    fVar2 = matrix->b2;
    fVar3 = matrix->b3;
    fVar4 = matrix->c1;
    fVar9 = matrix->c2;
    fVar16 = matrix->c3;
    fVar23 = matrix->d1;
    fVar24 = matrix->d2;
    fVar5 = matrix->d3;
    uVar6 = *(undefined8 *)((node->rotation).value + 2);
    fVar14 = (float)uVar6;
    fVar15 = (float)((ulong)uVar6 >> 0x20);
    uVar6 = *(undefined8 *)(node->rotation).value;
    fVar18 = (float)uVar6;
    fVar13 = (float)((ulong)uVar6 >> 0x20);
    fVar8 = fVar13 * fVar13 + fVar14 * fVar14;
    fVar11 = 1.0 - (fVar8 + fVar8);
    fVar7 = fVar18 * fVar13 - fVar14 * fVar15;
    fVar7 = fVar7 + fVar7;
    fVar12 = fVar18 * fVar14 + fVar13 * fVar15;
    fVar22 = fVar18 * fVar13 + fVar14 * fVar15;
    fVar8 = fVar14 * fVar14 + fVar18 * fVar18;
    fVar25 = 1.0 - (fVar8 + fVar8);
    fVar22 = fVar22 + fVar22;
    fVar8 = fVar13 * fVar14 - fVar15 * fVar18;
    fVar19 = fVar14 * fVar18 + -fVar13 * fVar15;
    fVar21 = fVar14 * fVar13 + fVar15 * fVar18;
    fVar18 = fVar18 * fVar18 + fVar13 * fVar13;
    fVar26 = 1.0 - (fVar18 + fVar18);
    fVar12 = fVar12 + fVar12;
    fVar19 = fVar19 + fVar19;
    fVar21 = fVar21 + fVar21;
    fVar8 = fVar8 + fVar8;
    fVar14 = matrix->a4 * 0.0;
    fVar15 = matrix->b4 * 0.0;
    fVar13 = matrix->c4 * 0.0;
    fVar18 = matrix->d4 * 0.0;
    matrix->a1 = fVar14 + fVar20 * fVar19 + fVar1 * fVar11 + fVar10 * fVar22;
    matrix->a2 = fVar14 + fVar20 * fVar21 + fVar1 * fVar7 + fVar10 * fVar25;
    matrix->a3 = fVar10 * fVar8 + fVar12 * fVar1 + fVar26 * fVar20 + fVar14;
    matrix->a4 = fVar20 * 0.0 + fVar1 * 0.0 + fVar10 * 0.0 + matrix->a4;
    matrix->b1 = fVar15 + fVar3 * fVar19 + fVar17 * fVar11 + fVar2 * fVar22;
    matrix->b2 = fVar15 + fVar3 * fVar21 + fVar17 * fVar7 + fVar2 * fVar25;
    matrix->b3 = fVar26 * fVar3 + fVar12 * fVar17 + fVar8 * fVar2 + fVar15;
    matrix->b4 = fVar3 * 0.0 + fVar17 * 0.0 + fVar2 * 0.0 + matrix->b4;
    matrix->c1 = fVar13 + fVar16 * fVar19 + fVar4 * fVar11 + fVar9 * fVar22;
    matrix->c2 = fVar13 + fVar16 * fVar21 + fVar4 * fVar7 + fVar9 * fVar25;
    matrix->c3 = fVar26 * fVar16 + fVar12 * fVar4 + fVar8 * fVar9 + fVar13;
    matrix->c4 = fVar16 * 0.0 + fVar4 * 0.0 + fVar9 * 0.0 + matrix->c4;
    matrix->d1 = fVar18 + fVar5 * fVar19 + fVar23 * fVar11 + fVar24 * fVar22;
    matrix->d2 = fVar18 + fVar5 * fVar21 + fVar23 * fVar7 + fVar24 * fVar25;
    matrix->d3 = fVar26 * fVar5 + fVar12 * fVar23 + fVar8 * fVar24 + fVar18;
    matrix->d4 = fVar5 * 0.0 + fVar23 * 0.0 + fVar24 * 0.0 + matrix->d4;
  }
  if ((node->scale).isPresent == true) {
    fVar1 = (node->scale).value[2];
    fVar10 = matrix->a1;
    fVar20 = matrix->b1;
    fVar17 = matrix->c1;
    fVar2 = (node->scale).value[0];
    fVar4 = (node->scale).value[1];
    fVar24 = matrix->a2 * 0.0;
    fVar9 = fVar10 * 0.0 + fVar24;
    fVar23 = matrix->a3 * 0.0;
    fVar16 = matrix->a4 * 0.0;
    fVar3 = matrix->d1;
    matrix->a1 = fVar16 + fVar23 + fVar10 * fVar2 + fVar24;
    matrix->a2 = fVar16 + fVar23 + fVar10 * 0.0 + matrix->a2 * fVar4;
    matrix->a3 = fVar1 * matrix->a3 + fVar9 + fVar16;
    matrix->a4 = fVar9 + fVar23 + matrix->a4;
    fVar23 = matrix->b2 * 0.0;
    fVar9 = fVar20 * 0.0 + fVar23;
    fVar16 = matrix->b3 * 0.0;
    fVar10 = matrix->b4 * 0.0;
    matrix->b1 = fVar10 + fVar16 + fVar20 * fVar2 + fVar23;
    matrix->b2 = fVar10 + fVar16 + fVar20 * 0.0 + matrix->b2 * fVar4;
    matrix->b3 = fVar1 * matrix->b3 + fVar9 + fVar10;
    matrix->b4 = fVar9 + fVar16 + matrix->b4;
    fVar20 = matrix->c2 * 0.0;
    fVar10 = fVar17 * 0.0 + fVar20;
    fVar9 = matrix->c3 * 0.0;
    fVar16 = matrix->c4 * 0.0;
    matrix->c1 = fVar16 + fVar9 + fVar17 * fVar2 + fVar20;
    matrix->c2 = fVar16 + fVar9 + fVar17 * 0.0 + matrix->c2 * fVar4;
    matrix->c3 = fVar1 * matrix->c3 + fVar10 + fVar16;
    matrix->c4 = fVar10 + fVar9 + matrix->c4;
    fVar9 = matrix->d2 * 0.0;
    fVar20 = fVar3 * 0.0 + fVar9;
    fVar17 = matrix->d3 * 0.0;
    fVar10 = matrix->d4 * 0.0;
    matrix->d1 = fVar10 + fVar17 + fVar3 * fVar2 + fVar9;
    matrix->d2 = fVar10 + fVar17 + fVar3 * 0.0 + matrix->d2 * fVar4;
    matrix->d3 = fVar1 * matrix->d3 + fVar20 + fVar10;
    matrix->d4 = fVar20 + fVar17 + matrix->d4;
  }
  return;
}

Assistant:

static void GetNodeTransform(aiMatrix4x4& matrix, const glTF2::Node& node) {
    if (node.matrix.isPresent) {
        CopyValue(node.matrix.value, matrix);
    }
    else {
        if (node.translation.isPresent) {
            aiVector3D trans;
            CopyValue(node.translation.value, trans);
            aiMatrix4x4 t;
            aiMatrix4x4::Translation(trans, t);
            matrix = matrix * t;
        }

        if (node.rotation.isPresent) {
            aiQuaternion rot;
            CopyValue(node.rotation.value, rot);
            matrix = matrix * aiMatrix4x4(rot.GetMatrix());
        }

        if (node.scale.isPresent) {
            aiVector3D scal(1.f);
            CopyValue(node.scale.value, scal);
            aiMatrix4x4 s;
            aiMatrix4x4::Scaling(scal, s);
            matrix = matrix * s;
        }
    }
}